

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorBuilder::ValidateMapEntry
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  long *plVar1;
  undefined8 *puVar2;
  int iVar3;
  Type TVar4;
  uint uVar5;
  undefined8 *puVar6;
  FieldDescriptor *pFVar7;
  FieldDescriptor *pFVar8;
  bool bVar9;
  FieldDescriptor *local_70;
  size_t local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  string local_50;
  
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_70 = field;
    std::
    call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),FieldDescriptor::TypeOnceInit,&local_70);
  }
  plVar1 = *(long **)(field + 0x68);
  if (((((*(int *)((long)plVar1 + 0x7c) == 0) && (*(int *)(field + 0x3c) == 3)) &&
       ((int)plVar1[0xf] == 0)) && (((int)plVar1[0xe] == 0 && (*(int *)((long)plVar1 + 0x74) == 0)))
      ) && ((int)plVar1[0xd] == 2)) {
    puVar2 = (undefined8 *)*plVar1;
    anon_unknown_1::ToCamelCase(&local_50,*(string **)field,false);
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
    pFVar8 = (FieldDescriptor *)&local_60;
    pFVar7 = (FieldDescriptor *)(puVar6 + 2);
    if ((FieldDescriptor *)*puVar6 == pFVar7) {
      local_60 = *(undefined8 *)pFVar7;
      uStack_58 = puVar6[3];
    }
    else {
      local_60 = *(undefined8 *)pFVar7;
      pFVar8 = (FieldDescriptor *)*puVar6;
    }
    local_68 = puVar6[1];
    *puVar6 = pFVar7;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    bVar9 = true;
    local_70 = pFVar8;
    if ((puVar2[1] == local_68) &&
       ((local_68 == 0 || (iVar3 = bcmp((void *)*puVar2,pFVar8,local_68), iVar3 == 0)))) {
      bVar9 = *(long *)(field + 0x50) != plVar1[3];
    }
    if (pFVar8 != (FieldDescriptor *)&local_60) {
      operator_delete(pFVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((((!bVar9) && (pFVar8 = (FieldDescriptor *)plVar1[5], *(int *)(pFVar8 + 0x3c) == 1)) &&
        (*(int *)(pFVar8 + 0x44) == 1)) &&
       (((iVar3 = std::__cxx11::string::compare(*(char **)pFVar8), iVar3 == 0 &&
         (*(int *)(pFVar8 + 0xd4) == 1)) && (*(int *)(pFVar8 + 0xdc) == 2)))) {
      pFVar7 = pFVar8 + 0x98;
      iVar3 = std::__cxx11::string::compare(*(char **)pFVar7);
      if (iVar3 == 0) {
        TVar4 = FieldDescriptor::type(pFVar8);
        uVar5 = TVar4 - TYPE_DOUBLE;
        if ((uVar5 < 0xe) && ((0x2e03U >> (uVar5 & 0x1f) & 1) != 0)) {
          AddError(this,*(string **)(field + 8),&proto->super_Message,TYPE,
                   &DAT_003e1bd8 + *(int *)(&DAT_003e1bd8 + (ulong)uVar5 * 4));
        }
        TVar4 = FieldDescriptor::type(pFVar7);
        if (TVar4 != TYPE_ENUM) {
          return true;
        }
        if (*(once_flag **)(pFVar8 + 200) != (once_flag *)0x0) {
          local_70 = pFVar7;
          std::
          call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(pFVar8 + 200),FieldDescriptor::TypeOnceInit,&local_70);
        }
        if (*(int *)(*(long *)(*(long *)(pFVar8 + 0x108) + 0x30) + 0x10) == 0) {
          return true;
        }
        AddError(this,*(string **)(field + 8),&proto->super_Message,TYPE,
                 "Enum value in map must define 0 as the first value.");
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool DescriptorBuilder::ValidateMapEntry(FieldDescriptor* field,
                                         const FieldDescriptorProto& proto) {
  const Descriptor* message = field->message_type();
  if (  // Must not contain extensions, extension range or nested message or
        // enums
      message->extension_count() != 0 ||
      field->label() != FieldDescriptor::LABEL_REPEATED ||
      message->extension_range_count() != 0 ||
      message->nested_type_count() != 0 || message->enum_type_count() != 0 ||
      // Must contain exactly two fields
      message->field_count() != 2 ||
      // Field name and message name must match
      message->name() != ToCamelCase(field->name(), false) + "Entry" ||
      // Entry message must be in the same containing type of the field.
      field->containing_type() != message->containing_type()) {
    return false;
  }

  const FieldDescriptor* key = message->field(0);
  const FieldDescriptor* value = message->field(1);
  if (key->label() != FieldDescriptor::LABEL_OPTIONAL || key->number() != 1 ||
      key->name() != "key") {
    return false;
  }
  if (value->label() != FieldDescriptor::LABEL_OPTIONAL ||
      value->number() != 2 || value->name() != "value") {
    return false;
  }

  // Check key types are legal.
  switch (key->type()) {
    case FieldDescriptor::TYPE_ENUM:
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Key in map fields cannot be enum types.");
      break;
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_BYTES:
      AddError(
          field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
          "Key in map fields cannot be float/double, bytes or message types.");
      break;
    case FieldDescriptor::TYPE_BOOL:
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_SFIXED64:
      // Legal cases
      break;
      // Do not add a default, so that the compiler will complain when new types
      // are added.
  }

  if (value->type() == FieldDescriptor::TYPE_ENUM) {
    if (value->enum_type()->value(0)->number() != 0) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Enum value in map must define 0 as the first value.");
    }
  }

  return true;
}